

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nussinov.cpp
# Opt level: O1

tuple<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
Nussinov::nussinov_abi_cxx11_
          (tuple<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Nussinov *this,ostream *fout)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  pointer ptVar10;
  pointer piVar11;
  pointer pdVar12;
  char cVar13;
  int a;
  int iVar14;
  int i;
  int iVar15;
  int iVar16;
  int iVar17;
  int a_00;
  bool bVar18;
  bool bVar19;
  int iVar20;
  int iVar21;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  int iVar22;
  int iVar23;
  int extraout_EAX_05;
  int extraout_EAX_06;
  int extraout_EAX_07;
  int extraout_EAX_08;
  int extraout_EAX_09;
  int extraout_EAX_10;
  int extraout_EAX_11;
  int extraout_EAX_12;
  int extraout_EAX_13;
  int extraout_EAX_14;
  int extraout_EAX_15;
  int extraout_EAX_16;
  long lVar24;
  ostream *poVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int (*paaiVar30) [6] [3];
  int iVar31;
  int iVar32;
  long lVar33;
  int (*paiVar34) [3];
  long lVar35;
  int iVar36;
  uint uVar37;
  long lVar38;
  char *pcVar39;
  ulong uVar40;
  int iVar41;
  int iVar42;
  long lVar43;
  int i_00;
  int iVar44;
  int iVar45;
  int iVar46;
  long lVar47;
  long lVar48;
  int iVar49;
  int iVar50;
  long lVar51;
  long lVar52;
  void *pvVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  long lVar57;
  long lVar58;
  ulong uVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  ulong uVar65;
  int iVar66;
  int iVar67;
  ulong uVar68;
  ulong uVar69;
  int iVar70;
  int (*paiVar71) [3];
  ulong uVar72;
  int iVar73;
  ulong uVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double local_2f8;
  double local_2f0;
  long local_2e0;
  ulong local_2d8;
  long local_2d0;
  int local_2bc;
  long local_2b8;
  long local_2a8;
  int local_29c;
  int local_294;
  ulong local_290;
  long local_288;
  long local_280;
  long local_278;
  ulong local_260;
  int (*local_258) [3];
  int (*local_250) [3];
  int local_240;
  int local_23c;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  int local_228;
  int local_224;
  int local_220;
  int local_21c;
  int local_218;
  int local_214;
  ulong local_210;
  int local_208;
  long local_1f0;
  ulong local_1e0;
  long local_138;
  long local_130;
  long local_128;
  long local_118;
  long local_110;
  string rna;
  string bp;
  
  std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>(fout,"Nussinov",8);
  cVar13 = (char)fout;
  std::ios::widen((char)*(undefined8 *)(*(long *)fout + -0x18) + cVar13);
  std::ostream::put(cVar13);
  std::ostream::flush();
  if (0 < this->n) {
    lVar33 = 0xd800000000;
    lVar47 = 0xb400000000;
    lVar51 = 0x6c00000000;
    pcVar39 = (char *)0x0;
    lVar57 = 0x4800000000;
    do {
      uVar37 = n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start[(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[(long)pcVar39]];
      local_290 = 3;
      paaiVar30 = nucleotides;
      local_2e0 = 0;
      lVar35 = lVar33;
      lVar48 = lVar47;
      lVar52 = lVar51;
      lVar58 = lVar57;
      do {
        local_250 = nucleotides[0];
        uVar74 = 0;
        local_2b8 = lVar35;
        local_288 = lVar48;
        local_280 = lVar52;
        local_278 = lVar58;
        local_258 = *paaiVar30;
        do {
          lVar2 = uVar74 + local_2e0;
          iVar32 = (int)pcVar39;
          iVar20 = sigma(iVar32,(int)lVar2);
          iVar46 = (int)uVar74;
          iVar21 = sigma(iVar32,iVar46);
          if ((this->g < iVar20 - iVar21) && (0 < (int)uVar37)) {
            iVar20 = iVar46 + (int)local_2e0;
            local_2d0 = local_280;
            local_2a8 = local_288;
            uVar68 = 0;
            paiVar34 = local_258;
            lVar38 = local_2b8;
            lVar43 = local_278;
            paiVar71 = local_250;
            do {
              lVar24 = (long)(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[(long)pcVar39];
              bVar18 = complementary(paiVar71[lVar24 * 6][0],paiVar34[lVar24 * 6][0]);
              dVar77 = 0.0;
              if ((((long)uVar74 < lVar2 + -1 && (lVar2 != 0 && uVar74 < 2)) && bVar18) &&
                 (dVar77 = *(double *)
                            ((long)(this->value).super__Vector_base<double,_std::allocator<double>_>
                                   ._M_impl.super__Vector_impl_data._M_start + (lVar43 >> 0x1d)) +
                           1.0, dVar77 <= 0.0)) {
                dVar77 = 0.0;
              }
              dVar78 = dVar77;
              if ((uVar74 < 2 && local_2e0 != 0) &&
                 (dVar78 = *(double *)
                            ((long)(this->value).super__Vector_base<double,_std::allocator<double>_>
                                   ._M_impl.super__Vector_impl_data._M_start + (local_2d0 >> 0x1d)),
                 dVar78 <= dVar77)) {
                dVar78 = dVar77;
              }
              local_2f0 = dVar78;
              if ((lVar2 != 0 && local_2e0 != 0) &&
                 (local_2f0 = *(double *)
                               ((long)(this->value).
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start + (local_2a8 >> 0x1d)),
                 local_2f0 <= dVar78)) {
                local_2f0 = dVar78;
              }
              m((void *)(ulong)(uint)this->n,iVar32,(char *)((ulong)pcVar39 & 0xffffffff),iVar46,
                iVar20);
              ptVar10 = (this->codon_index).
                        super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + extraout_EAX;
              iVar21 = (int)uVar68;
              if (*(double *)
                   &(ptVar10->super__Tuple_impl<0UL,_int,_int,_double>).
                    super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> <= local_2f0
                  && local_2f0 !=
                     *(double *)
                      &(ptVar10->super__Tuple_impl<0UL,_int,_int,_double>).
                       super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double>) {
                m((void *)(ulong)(uint)this->n,iVar32,(char *)((ulong)pcVar39 & 0xffffffff),iVar46,
                  iVar20);
                ptVar10 = (this->codon_index).
                          super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                *(int *)&ptVar10[extraout_EAX_00].super__Tuple_impl<0UL,_int,_int,_double>.
                         super__Tuple_impl<1UL,_int,_double>.field_0xc = iVar21;
                ptVar10[extraout_EAX_00].super__Tuple_impl<0UL,_int,_int,_double>.
                super__Tuple_impl<1UL,_int,_double>.super__Head_base<1UL,_int,_false>._M_head_impl =
                     iVar21;
                ptVar10[extraout_EAX_00].super__Tuple_impl<0UL,_int,_int,_double>.
                super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> =
                     (_Tuple_impl<2UL,_double>)local_2f0;
              }
              m((void *)(ulong)(uint)this->n,iVar32,(char *)((ulong)pcVar39 & 0xffffffff),iVar46,
                iVar20);
              ptVar10 = (this->codon_index_x).
                        super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + extraout_EAX_01;
              if (*(double *)
                   &(ptVar10->super__Tuple_impl<0UL,_int,_int,_double>).
                    super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> <= local_2f0
                  && local_2f0 !=
                     *(double *)
                      &(ptVar10->super__Tuple_impl<0UL,_int,_int,_double>).
                       super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double>) {
                m((void *)(ulong)(uint)this->n,iVar32,(char *)((ulong)pcVar39 & 0xffffffff),iVar46,
                  iVar20);
                ptVar10 = (this->codon_index_x).
                          super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                *(int *)&ptVar10[extraout_EAX_02].super__Tuple_impl<0UL,_int,_int,_double>.
                         super__Tuple_impl<1UL,_int,_double>.field_0xc = iVar21;
                ptVar10[extraout_EAX_02].super__Tuple_impl<0UL,_int,_int,_double>.
                super__Tuple_impl<1UL,_int,_double>.super__Head_base<1UL,_int,_false>._M_head_impl =
                     iVar21;
                ptVar10[extraout_EAX_02].super__Tuple_impl<0UL,_int,_int,_double>.
                super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> =
                     (_Tuple_impl<2UL,_double>)local_2f0;
              }
              m((void *)(ulong)(uint)this->n,iVar32,(char *)((ulong)pcVar39 & 0xffffffff),iVar46,
                iVar20);
              ptVar10 = (this->codon_index_y).
                        super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + extraout_EAX_03;
              if (*(double *)
                   &(ptVar10->super__Tuple_impl<0UL,_int,_int,_double>).
                    super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> <= local_2f0
                  && local_2f0 !=
                     *(double *)
                      &(ptVar10->super__Tuple_impl<0UL,_int,_int,_double>).
                       super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double>) {
                m((void *)(ulong)(uint)this->n,iVar32,pcVar39,iVar46,iVar20);
                ptVar10 = (this->codon_index_y).
                          super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                *(int *)&ptVar10[extraout_EAX_04].super__Tuple_impl<0UL,_int,_int,_double>.
                         super__Tuple_impl<1UL,_int,_double>.field_0xc = iVar21;
                ptVar10[extraout_EAX_04].super__Tuple_impl<0UL,_int,_int,_double>.
                super__Tuple_impl<1UL,_int,_double>.super__Head_base<1UL,_int,_false>._M_head_impl =
                     iVar21;
                ptVar10[extraout_EAX_04].super__Tuple_impl<0UL,_int,_int,_double>.
                super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> =
                     (_Tuple_impl<2UL,_double>)local_2f0;
              }
              *(double *)
               ((long)(this->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + (lVar38 >> 0x1d)) = local_2f0;
              uVar68 = uVar68 + 1;
              lVar38 = lVar38 + 0x700000000;
              local_2a8 = local_2a8 + 0x700000000;
              local_2d0 = local_2d0 + 0x700000000;
              lVar43 = lVar43 + 0x700000000;
              paiVar34 = paiVar34 + 1;
              paiVar71 = paiVar71 + 1;
            } while (uVar37 != uVar68);
          }
          uVar74 = uVar74 + 1;
          local_2b8 = local_2b8 + -0x4800000000;
          local_288 = local_288 + -0x4800000000;
          local_280 = local_280 + -0x4800000000;
          local_278 = local_278 + -0x4800000000;
          local_258 = (int (*) [3])(*local_258 + 1);
          local_250 = (int (*) [3])(*local_250 + 1);
        } while (uVar74 != local_290);
        local_2e0 = local_2e0 + 1;
        local_290 = local_290 - 1;
        lVar35 = lVar35 + 0x2400000000;
        lVar48 = lVar48 + 0x2400000000;
        lVar52 = lVar52 + 0x2400000000;
        lVar58 = lVar58 + 0x2400000000;
        paaiVar30 = (int (*) [6] [3])((*paaiVar30)[0] + 1);
      } while (local_2e0 != 3);
      pcVar39 = pcVar39 + 1;
      lVar33 = lVar33 + 0x14400000000;
      lVar47 = lVar47 + 0x14400000000;
      lVar51 = lVar51 + 0x14400000000;
      lVar57 = lVar57 + 0x14400000000;
    } while ((long)pcVar39 < (long)this->n);
  }
  pvVar53 = (void *)(ulong)(uint)this->n;
  local_2f8 = 0.0;
  if (1 < this->n) {
    uVar74 = 1;
    iVar21 = 0x1f8;
    iVar20 = 0;
    local_29c = -0x24;
    iVar32 = 0x21c;
    iVar46 = 0x48;
    iVar56 = 0x1b0;
    local_290._0_4_ = 0x24;
    lVar33 = 0x1b000000000;
    local_2f8 = 0.0;
    iVar62 = 0x288;
    iVar64 = -0x24;
    local_210 = 0;
    do {
      if ((long)uVar74 < (long)this->n) {
        local_260 = 1;
        iVar50 = 0x18c;
        iVar42 = 0x144;
        lVar47 = 0x4800000000;
        local_1e0 = local_210;
        uVar68 = 0;
        iVar61 = iVar62;
        iVar63 = iVar64;
        iVar55 = iVar46;
        iVar67 = iVar32;
        local_240 = iVar21;
        local_23c = iVar56;
        local_138 = lVar33;
        do {
          uVar3 = uVar68 + uVar74;
          a = (int)uVar68;
          iVar14 = (int)uVar74;
          pcVar39 = (char *)(ulong)(uint)(a + iVar14);
          piVar11 = (this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar37 = n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[piVar11[uVar68]];
          uVar9 = n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[piVar11[uVar3]];
          iVar31 = (a + iVar14) * 2;
          iVar26 = iVar31 - a;
          uVar1 = uVar68 + 1;
          iVar31 = iVar31 - (int)uVar1;
          uVar4 = (uVar68 - 1) + uVar74;
          a_00 = (int)uVar3;
          uVar40 = 2;
          local_118 = 0;
          local_238 = iVar63;
          local_234 = iVar55;
          local_230 = iVar50;
          local_22c = iVar42;
          local_228 = iVar61;
          local_130 = lVar47;
          iVar45 = iVar67;
          do {
            i = (int)uVar40;
            iVar16 = (i * -3 + a * 9 + 8) * 0x24;
            local_128 = local_138;
            local_218 = local_23c;
            local_220 = local_240;
            lVar51 = 0;
            local_224 = iVar45;
            local_21c = iVar67;
            do {
              i_00 = (int)lVar51;
              iVar22 = sigma(a_00,i_00);
              iVar23 = sigma(a,i);
              dVar77 = local_2f8;
              if ((this->g < iVar22 - iVar23) && (0 < (int)uVar37)) {
                bVar18 = lVar51 == 0;
                local_208 = (a_00 * 9 + 6 + i_00) * 0x24;
                local_110 = local_130;
                local_294 = local_234;
                local_214 = local_238;
                local_2d8 = 0;
                iVar44 = local_228;
                iVar49 = local_224;
                iVar22 = local_22c;
                iVar23 = local_230;
                do {
                  if (0 < (int)uVar9) {
                    iVar15 = (int)local_2d8;
                    iVar17 = iVar15 * 7;
                    iVar27 = iVar15 * 6;
                    local_1f0 = local_128;
                    uVar69 = 0;
                    local_2bc = iVar44;
                    iVar8 = iVar49;
                    iVar7 = local_218;
                    iVar6 = local_21c;
                    iVar5 = local_220;
                    do {
                      piVar11 = (this->protein).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                      bVar19 = complementary(nucleotides[piVar11[uVar68]][local_2d8][uVar40],
                                             nucleotides[piVar11[uVar3]][uVar69][lVar51]);
                      dVar78 = 0.0;
                      iVar66 = (int)uVar69;
                      if (bVar19) {
                        if ((uVar40 < 2 && !bVar18) &&
                           (dVar78 = (this->value).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start
                                     [iVar27 + iVar66 +
                                      ((this->n * 9 + -9) * iVar14 + iVar26 * 9 + 2 + i * -3 + i_00)
                                      * 0x24] + 1.0, dVar78 <= 0.0)) {
                          dVar78 = 0.0;
                        }
                        if (!bVar18 && uVar40 == 2) {
                          dVar75 = dVar78;
                          if (1 < uVar74) {
                            lVar57 = (long)n_codon.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start
                                           [(this->protein).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start[uVar1]];
                            dVar75 = 1.0;
                            if (0 < lVar57) {
                              iVar28 = (this->n * 9 + -9) * iVar20 + iVar5;
                              dVar76 = 0.0;
                              do {
                                dVar75 = (this->value).
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start[iVar28];
                                if (dVar75 <= dVar76) {
                                  dVar75 = dVar76;
                                }
                                iVar28 = iVar28 + 6;
                                lVar57 = lVar57 + -1;
                                dVar76 = dVar75;
                              } while (lVar57 != 0);
                              dVar75 = dVar75 + 1.0;
                            }
                            if (dVar75 <= dVar78) {
                              dVar75 = dVar78;
                            }
                          }
                          dVar78 = dVar75;
                          if ((uVar74 == 1) &&
                             (dVar78 = (this->value).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start
                                       [iVar66 * 7 +
                                        ((this->n * 9 + -9) * (int)local_210 + iVar31 * 9 + 5 + i_00
                                        ) * 0x24] + 1.0, dVar78 <= dVar75)) {
                            dVar78 = dVar75;
                          }
                        }
                        if (uVar40 < 2 && bVar18) {
                          dVar75 = dVar78;
                          if (uVar68 < uVar4) {
                            lVar57 = (long)n_codon.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start
                                           [(this->protein).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start[uVar3 - 1]];
                            dVar75 = 1.0;
                            if (0 < lVar57) {
                              iVar28 = (this->n * 9 + -9) * iVar20 + local_214;
                              dVar76 = 0.0;
                              do {
                                dVar75 = (this->value).
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start[iVar28];
                                if (dVar75 <= dVar76) {
                                  dVar75 = dVar76;
                                }
                                iVar28 = iVar28 + 1;
                                lVar57 = lVar57 + -1;
                                dVar76 = dVar75;
                              } while (lVar57 != 0);
                              dVar75 = dVar75 + 1.0;
                            }
                            if (dVar75 <= dVar78) {
                              dVar75 = dVar78;
                            }
                          }
                          dVar78 = dVar75;
                          if ((uVar68 == uVar4) &&
                             (dVar78 = (this->value).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start
                                       [(iVar26 * 9 + -0xd + i * -3) * 0x24 + iVar17] + 1.0,
                             dVar78 <= dVar75)) {
                            dVar78 = dVar75;
                          }
                        }
                        if (uVar40 == 2 && bVar18) {
                          dVar75 = dVar78;
                          if (uVar1 < uVar4) {
                            piVar11 = (this->protein).super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start;
                            dVar75 = 1.0;
                            if (0 < (long)n_codon.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start[piVar11[uVar1]])
                            {
                              iVar28 = (this->n * 9 + -9) * local_29c + iVar63;
                              dVar75 = 0.0;
                              lVar57 = 0;
                              do {
                                uVar59 = (ulong)(uint)n_codon.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start
                                                  [piVar11[uVar3 - 1]];
                                iVar60 = iVar28;
                                if (0 < n_codon.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start[piVar11[uVar3 - 1]]
                                   ) {
                                  do {
                                    dVar76 = (this->value).
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start[iVar60];
                                    if (dVar76 <= dVar75) {
                                      dVar76 = dVar75;
                                    }
                                    dVar75 = dVar76;
                                    iVar60 = iVar60 + 1;
                                    uVar59 = uVar59 - 1;
                                  } while (uVar59 != 0);
                                }
                                lVar57 = lVar57 + 1;
                                iVar28 = iVar28 + 6;
                              } while (lVar57 != n_codon.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start
                                                 [piVar11[uVar1]]);
                              dVar75 = dVar75 + 1.0;
                            }
                            if (dVar75 <= dVar78) {
                              dVar75 = dVar78;
                            }
                          }
                          local_2f8 = dVar75;
                          if (uVar1 == uVar4) {
                            lVar57 = (long)n_codon.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start
                                           [(this->protein).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start[uVar1]];
                            local_2f8 = 1.0;
                            if (0 < lVar57) {
                              iVar28 = (this->n * 9 + -9) * local_29c + iVar63;
                              dVar78 = 0.0;
                              do {
                                local_2f8 = (this->value).
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start[iVar28];
                                if (local_2f8 <= dVar78) {
                                  local_2f8 = dVar78;
                                }
                                iVar28 = iVar28 + 7;
                                lVar57 = lVar57 + -1;
                                dVar78 = local_2f8;
                              } while (lVar57 != 0);
                              local_2f8 = local_2f8 + 1.0;
                            }
                            if (local_2f8 <= dVar75) {
                              local_2f8 = dVar75;
                            }
                          }
                          iVar28 = sigma(a_00,0);
                          iVar60 = sigma(a,2);
                          dVar78 = local_2f8;
                          if ((iVar28 + -1 == iVar60 + this->g) && (dVar78 = 1.0, 1.0 <= local_2f8))
                          {
                            dVar78 = local_2f8;
                          }
                        }
                      }
                      dVar75 = dVar78;
                      if ((uVar40 < 2) &&
                         (dVar75 = (this->value).super__Vector_base<double,_std::allocator<double>_>
                                   ._M_impl.super__Vector_impl_data._M_start
                                   [iVar27 + iVar66 +
                                    ((this->n * 9 + -9) * iVar14 + iVar26 * 9 + 3 + i * -3 + i_00) *
                                    0x24], dVar75 <= dVar78)) {
                        dVar75 = dVar78;
                      }
                      dVar78 = dVar75;
                      if ((lVar51 != 0) &&
                         (dVar78 = (this->value).super__Vector_base<double,_std::allocator<double>_>
                                   ._M_impl.super__Vector_impl_data._M_start
                                   [iVar27 + iVar66 +
                                    ((this->n * 9 + -9) * iVar14 + iVar26 * 9 + 5 + i * -3 + i_00) *
                                    0x24], dVar78 <= dVar75)) {
                        dVar78 = dVar75;
                      }
                      dVar75 = dVar78;
                      if (uVar40 == 2) {
                        if ((1 < uVar74) &&
                           (lVar57 = (long)n_codon.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start
                                           [(this->protein).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start[uVar1]], 0 < lVar57)) {
                          iVar28 = (this->n * 9 + -9) * iVar20 + iVar6;
                          do {
                            dVar78 = (this->value).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start[iVar28];
                            if (dVar78 <= dVar75) {
                              dVar78 = dVar75;
                            }
                            iVar28 = iVar28 + 6;
                            lVar57 = lVar57 + -1;
                            dVar75 = dVar78;
                          } while (lVar57 != 0);
                        }
                        dVar75 = dVar78;
                        if ((uVar74 == 1) &&
                           (dVar75 = (this->value).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start
                                     [iVar66 * 7 +
                                      ((this->n * 9 + -9) * (int)local_210 + iVar31 * 9 + 6 + i_00)
                                      * 0x24], dVar75 <= dVar78)) {
                          dVar75 = dVar78;
                        }
                      }
                      dVar78 = dVar75;
                      if (lVar51 == 0) {
                        if ((uVar68 < uVar4) &&
                           (lVar57 = (long)n_codon.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start
                                           [(this->protein).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start[uVar3 - 1]], 0 < lVar57
                           )) {
                          iVar28 = (this->n * 9 + -9) * iVar20 + local_294;
                          do {
                            dVar75 = (this->value).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start[iVar28];
                            if (dVar75 <= dVar78) {
                              dVar75 = dVar78;
                            }
                            iVar28 = iVar28 + 1;
                            lVar57 = lVar57 + -1;
                            dVar78 = dVar75;
                          } while (lVar57 != 0);
                        }
                        dVar78 = dVar75;
                        if ((uVar68 == uVar4) &&
                           (dVar78 = (this->value).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start
                                     [(iVar26 * 9 + -10 + i * -3) * 0x24 + iVar17], dVar78 <= dVar75
                           )) {
                          dVar78 = dVar75;
                        }
                      }
                      if (uVar1 < uVar4 && (long)uVar68 < (long)(uVar68 + uVar74 + -2)) {
                        pdVar12 = (this->value).super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                        piVar11 = (this->protein).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                        iVar28 = this->n * 0x144;
                        iVar60 = iVar23 + iVar28;
                        uVar59 = local_260;
                        do {
                          uVar65 = uVar59 + 1;
                          if (0 < n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[piVar11[uVar59 + 1]]) {
                            iVar73 = 0;
                            do {
                              if (0 < n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start[piVar11[uVar59]]) {
                                uVar72 = (ulong)(uint)n_codon.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start
                                                  [piVar11[uVar59]];
                                dVar75 = dVar78;
                                iVar36 = iVar60;
                                do {
                                  dVar78 = pdVar12[iVar36] +
                                           pdVar12[iVar66 + iVar73 * 6 +
                                                   ((a_00 * 2 - (int)uVar65) * 9 + i_00 + 6 +
                                                   (a_00 - (int)uVar65) * (this->n * 9 + -9)) * 0x24
                                                  ];
                                  if (dVar78 <= dVar75) {
                                    dVar78 = dVar75;
                                  }
                                  iVar36 = iVar36 + 1;
                                  uVar72 = uVar72 - 1;
                                  dVar75 = dVar78;
                                } while (uVar72 != 0);
                              }
                              iVar73 = iVar73 + 1;
                            } while (iVar73 != n_codon.super__Vector_base<int,_std::allocator<int>_>
                                               ._M_impl.super__Vector_impl_data._M_start
                                               [piVar11[uVar59 + 1]]);
                          }
                          iVar60 = iVar60 + iVar28 + 0x144;
                          uVar59 = uVar65;
                        } while (uVar65 != local_1e0);
                      }
                      if ((uVar68 < uVar4) &&
                         (lVar57 = (long)n_codon.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start
                                         [(this->protein).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start[uVar1]], 0 < lVar57)) {
                        pdVar12 = (this->value).super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                        iVar28 = (this->n * 9 + -9) * iVar20 + iVar6;
                        do {
                          dVar75 = pdVar12[iVar28] + pdVar12[iVar17 + iVar16];
                          if (dVar75 <= dVar78) {
                            dVar75 = dVar78;
                          }
                          dVar78 = dVar75;
                          iVar28 = iVar28 + 6;
                          lVar57 = lVar57 + -1;
                        } while (lVar57 != 0);
                      }
                      if ((uVar68 < uVar4) &&
                         (lVar57 = (long)n_codon.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start
                                         [(this->protein).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start[uVar3 - 1]], 0 < lVar57))
                      {
                        pdVar12 = (this->value).super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                        iVar28 = (this->n * 9 + -9) * iVar20 + local_294;
                        dVar75 = dVar78;
                        do {
                          dVar78 = pdVar12[iVar28] + pdVar12[iVar66 * 7 + local_208];
                          if (dVar78 <= dVar75) {
                            dVar78 = dVar75;
                          }
                          iVar28 = iVar28 + 1;
                          lVar57 = lVar57 + -1;
                          dVar75 = dVar78;
                        } while (lVar57 != 0);
                      }
                      dVar75 = dVar78;
                      if ((uVar68 == uVar4) &&
                         (pdVar12 = (this->value).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                         dVar75 = pdVar12[iVar17 + iVar16] + pdVar12[iVar66 * 7 + local_208],
                         dVar75 <= dVar78)) {
                        dVar75 = dVar78;
                      }
                      if (uVar68 < uVar4 && 1 < uVar74) {
                        pdVar12 = (this->value).super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                        iVar28 = this->n;
                        iVar73 = iVar22 + iVar28 * 0x144;
                        iVar60 = (iVar28 * 9 + -9) * iVar20 + iVar7;
                        uVar59 = local_260;
                        do {
                          iVar70 = 0;
                          iVar36 = iVar60;
                          iVar54 = iVar73;
                          do {
                            uVar65 = (ulong)(uint)n_codon.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start
                                                  [(this->protein).
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_start[uVar59]]
                            ;
                            iVar29 = iVar54;
                            iVar41 = iVar36;
                            if (0 < n_codon.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start
                                    [(this->protein).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start[uVar59]]) {
                              do {
                                dVar78 = pdVar12[iVar29] + pdVar12[iVar41];
                                if (dVar78 <= dVar75) {
                                  dVar78 = dVar75;
                                }
                                dVar75 = dVar78;
                                iVar29 = iVar29 + 1;
                                iVar41 = iVar41 + 6;
                                uVar65 = uVar65 - 1;
                              } while (uVar65 != 0);
                            }
                            iVar54 = iVar54 + 0x24;
                            iVar36 = iVar36 + -0x6c;
                            bVar19 = iVar70 == 0;
                            iVar70 = iVar70 + 1;
                          } while (bVar19);
                          uVar59 = uVar59 + 1;
                          iVar73 = iVar73 + iVar28 * 0x144 + 0x144;
                          iVar60 = iVar60 + iVar28 * -0x144;
                        } while (uVar59 < uVar3);
                      }
                      if (uVar40 < 2) {
                        pdVar12 = (this->value).super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                        iVar28 = (this->n * 9 + -9) * (int)local_290 + iVar8;
                        lVar57 = local_110;
                        lVar35 = local_118;
                        do {
                          dVar78 = *(double *)((long)pdVar12 + (lVar57 >> 0x1d)) + pdVar12[iVar28];
                          if (dVar78 <= dVar75) {
                            dVar78 = dVar75;
                          }
                          dVar75 = dVar78;
                          lVar57 = lVar57 + 0x2400000000;
                          iVar28 = iVar28 + -0x6c;
                          lVar35 = lVar35 + -1;
                        } while (lVar35 != 0);
                      }
                      if (lVar51 != 0) {
                        pdVar12 = (this->value).super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                        iVar28 = (this->n * 9 + -9) * (int)local_290 + local_2bc;
                        lVar57 = local_1f0;
                        lVar35 = lVar51;
                        dVar78 = dVar75;
                        do {
                          dVar75 = pdVar12[iVar28] + *(double *)((long)pdVar12 + (lVar57 >> 0x1d));
                          if (dVar75 <= dVar78) {
                            dVar75 = dVar78;
                          }
                          iVar28 = iVar28 + 0x24;
                          lVar57 = lVar57 + -0x6c00000000;
                          lVar35 = lVar35 + -1;
                          dVar78 = dVar75;
                        } while (lVar35 != 0);
                      }
                      m((void *)(ulong)(uint)this->n,a,pcVar39,i,i_00);
                      ptVar10 = (this->codon_index).
                                super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + extraout_EAX_05;
                      if (*(double *)
                           &(ptVar10->super__Tuple_impl<0UL,_int,_int,_double>).
                            super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> <=
                          dVar75 && dVar75 != *(double *)
                                               &(ptVar10->super__Tuple_impl<0UL,_int,_int,_double>).
                                                super__Tuple_impl<1UL,_int,_double>.
                                                super__Tuple_impl<2UL,_double>) {
                        m((void *)(ulong)(uint)this->n,a,pcVar39,i,i_00);
                        ptVar10 = (this->codon_index).
                                  super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        *(int *)&ptVar10[extraout_EAX_06].super__Tuple_impl<0UL,_int,_int,_double>.
                                 super__Tuple_impl<1UL,_int,_double>.field_0xc = iVar15;
                        ptVar10[extraout_EAX_06].super__Tuple_impl<0UL,_int,_int,_double>.
                        super__Tuple_impl<1UL,_int,_double>.super__Head_base<1UL,_int,_false>.
                        _M_head_impl = iVar66;
                        ptVar10[extraout_EAX_06].super__Tuple_impl<0UL,_int,_int,_double>.
                        super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> =
                             (_Tuple_impl<2UL,_double>)dVar75;
                      }
                      m((void *)(ulong)(uint)this->n,a,pcVar39,i,i_00);
                      ptVar10 = (this->codon_index_x).
                                super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + extraout_EAX_07;
                      if (*(double *)
                           &(ptVar10->super__Tuple_impl<0UL,_int,_int,_double>).
                            super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> <=
                          dVar75 && dVar75 != *(double *)
                                               &(ptVar10->super__Tuple_impl<0UL,_int,_int,_double>).
                                                super__Tuple_impl<1UL,_int,_double>.
                                                super__Tuple_impl<2UL,_double>) {
                        m((void *)(ulong)(uint)this->n,a,pcVar39,i,i_00);
                        ptVar10 = (this->codon_index_x).
                                  super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        *(int *)&ptVar10[extraout_EAX_08].super__Tuple_impl<0UL,_int,_int,_double>.
                                 super__Tuple_impl<1UL,_int,_double>.field_0xc = iVar15;
                        ptVar10[extraout_EAX_08].super__Tuple_impl<0UL,_int,_int,_double>.
                        super__Tuple_impl<1UL,_int,_double>.super__Head_base<1UL,_int,_false>.
                        _M_head_impl = iVar66;
                        ptVar10[extraout_EAX_08].super__Tuple_impl<0UL,_int,_int,_double>.
                        super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> =
                             (_Tuple_impl<2UL,_double>)dVar75;
                      }
                      m((void *)(ulong)(uint)this->n,a,pcVar39,i,i_00);
                      ptVar10 = (this->codon_index_y).
                                super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + extraout_EAX_09;
                      if (*(double *)
                           &(ptVar10->super__Tuple_impl<0UL,_int,_int,_double>).
                            super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> <=
                          dVar75 && dVar75 != *(double *)
                                               &(ptVar10->super__Tuple_impl<0UL,_int,_int,_double>).
                                                super__Tuple_impl<1UL,_int,_double>.
                                                super__Tuple_impl<2UL,_double>) {
                        m((void *)(ulong)(uint)this->n,a,pcVar39,i,i_00);
                        ptVar10 = (this->codon_index_y).
                                  super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        *(int *)&ptVar10[extraout_EAX_10].super__Tuple_impl<0UL,_int,_int,_double>.
                                 super__Tuple_impl<1UL,_int,_double>.field_0xc = iVar15;
                        ptVar10[extraout_EAX_10].super__Tuple_impl<0UL,_int,_int,_double>.
                        super__Tuple_impl<1UL,_int,_double>.super__Head_base<1UL,_int,_false>.
                        _M_head_impl = iVar66;
                        ptVar10[extraout_EAX_10].super__Tuple_impl<0UL,_int,_int,_double>.
                        super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double> =
                             (_Tuple_impl<2UL,_double>)dVar75;
                      }
                      (this->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start
                      [iVar27 + iVar66 +
                       ((this->n * 9 + -9) * iVar14 + iVar26 * 9 + 6 + i * -3 + i_00) * 0x24] =
                           dVar75;
                      if (dVar75 <= dVar77) {
                        dVar75 = dVar77;
                      }
                      dVar77 = dVar75;
                      uVar69 = uVar69 + 1;
                      iVar5 = iVar5 + 1;
                      iVar6 = iVar6 + 1;
                      iVar7 = iVar7 + 1;
                      iVar8 = iVar8 + 1;
                      local_2bc = local_2bc + 1;
                      local_1f0 = local_1f0 + 0x700000000;
                    } while (uVar69 != uVar9);
                  }
                  local_2d8 = local_2d8 + 1;
                  local_214 = local_214 + 6;
                  local_294 = local_294 + 6;
                  iVar23 = iVar23 + 6;
                  iVar22 = iVar22 + 6;
                  local_110 = local_110 + 0x700000000;
                  iVar49 = iVar49 + 6;
                  iVar44 = iVar44 + 6;
                } while (local_2d8 != uVar37);
              }
              lVar51 = lVar51 + 1;
              local_220 = local_220 + 0x24;
              local_21c = local_21c + 0x24;
              local_218 = local_218 + 0x24;
              local_224 = local_224 + 0x24;
              local_128 = local_128 + 0x2400000000;
              local_2f8 = dVar77;
            } while (lVar51 != 3);
            local_238 = local_238 + 0x6c;
            local_234 = local_234 + 0x6c;
            local_230 = local_230 + 0x6c;
            local_22c = local_22c + 0x6c;
            local_130 = local_130 + 0x4800000000;
            iVar45 = iVar45 + 0x6c;
            local_118 = local_118 + 1;
            local_228 = local_228 + 0x6c;
            bVar18 = uVar40 != 0;
            uVar40 = uVar40 - 1;
          } while (bVar18);
          local_260 = local_260 + 1;
          local_1e0 = local_1e0 + 1;
          local_240 = local_240 + 0x144;
          iVar63 = iVar63 + 0x144;
          iVar67 = iVar67 + 0x144;
          iVar55 = iVar55 + 0x144;
          iVar50 = iVar50 + 0x144;
          iVar42 = iVar42 + 0x144;
          local_23c = local_23c + 0x144;
          lVar47 = lVar47 + 0x14400000000;
          iVar61 = iVar61 + 0x144;
          local_138 = local_138 + 0x14400000000;
          uVar68 = uVar1;
        } while ((long)(uVar1 + uVar74) < (long)this->n);
      }
      uVar74 = uVar74 + 1;
      pvVar53 = (void *)(long)this->n;
      local_210 = local_210 + 1;
      iVar21 = iVar21 + 0x288;
      iVar20 = iVar20 + 0x24;
      iVar64 = iVar64 + 0x288;
      local_29c = local_29c + 0x24;
      iVar32 = iVar32 + 0x288;
      iVar46 = iVar46 + 0x288;
      iVar56 = iVar56 + 0x288;
      local_290._0_4_ = (int)local_290 + 0x24;
      iVar62 = iVar62 + 0x288;
      lVar33 = lVar33 + 0x14400000000;
    } while ((long)uVar74 < (long)pvVar53);
  }
  uVar37 = (int)pvVar53 - 1;
  m(pvVar53,0,(char *)(ulong)uVar37,0,2);
  iVar20 = *(int *)&(this->codon_index).
                    super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[extraout_EAX_11].
                    super__Tuple_impl<0UL,_int,_int,_double>.super__Tuple_impl<1UL,_int,_double>.
                    field_0xc;
  m((void *)(ulong)(uint)this->n,0,(char *)(ulong)(this->n - 1),0,2);
  find_bp_abi_cxx11_(&bp,this,0,uVar37,0,2,iVar20,
                     (this->codon_index).
                     super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[extraout_EAX_12].
                     super__Tuple_impl<0UL,_int,_int,_double>.super__Tuple_impl<1UL,_int,_double>.
                     super__Head_base<1UL,_int,_false>._M_head_impl,0);
  uVar37 = this->n - 1;
  m((void *)(ulong)(uint)this->n,0,(char *)(ulong)uVar37,0,2);
  iVar20 = *(int *)&(this->codon_index).
                    super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[extraout_EAX_13].
                    super__Tuple_impl<0UL,_int,_int,_double>.super__Tuple_impl<1UL,_int,_double>.
                    field_0xc;
  m((void *)(ulong)(uint)this->n,0,(char *)(ulong)(this->n - 1),0,2);
  find_bp_abi_cxx11_(&rna,this,0,uVar37,0,2,iVar20,
                     (this->codon_index).
                     super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[extraout_EAX_14].
                     super__Tuple_impl<0UL,_int,_int,_double>.super__Tuple_impl<1UL,_int,_double>.
                     super__Head_base<1UL,_int,_false>._M_head_impl,1);
  std::__ostream_insert<char,std::char_traits<char>>(fout,"corresponding base pairs: ",0x1a);
  poVar25 = std::__ostream_insert<char,std::char_traits<char>>
                      (fout,bp._M_dataplus._M_p,bp._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar25,",length: ",9);
  poVar25 = std::ostream::_M_insert<unsigned_long>((ulong)poVar25);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar25 + -0x18) + (char)poVar25);
  std::ostream::put((char)poVar25);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(fout,"corresponding rna: ",0x13);
  poVar25 = std::__ostream_insert<char,std::char_traits<char>>
                      (fout,rna._M_dataplus._M_p,rna._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar25,",size: ",7);
  poVar25 = std::ostream::_M_insert<unsigned_long>((ulong)poVar25);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar25 + -0x18) + (char)poVar25);
  std::ostream::put((char)poVar25);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(fout,"max base pair: ",0xf);
  poVar25 = std::ostream::_M_insert<double>(local_2f8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar25 + -0x18) + (char)poVar25);
  std::ostream::put((char)poVar25);
  std::ostream::flush();
  std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>(fout,"Time taken by program is : ",0x1b);
  std::ostream::_M_insert<long>((long)fout);
  std::__ostream_insert<char,std::char_traits<char>>(fout,"sec",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)fout + -0x18) + cVar13);
  std::ostream::put(cVar13);
  std::ostream::flush();
  uVar37 = this->n - 1;
  m((void *)(ulong)(uint)this->n,0,(char *)(ulong)uVar37,0,2);
  iVar20 = *(int *)&(this->codon_index).
                    super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[extraout_EAX_15].
                    super__Tuple_impl<0UL,_int,_int,_double>.super__Tuple_impl<1UL,_int,_double>.
                    field_0xc;
  m((void *)(ulong)(uint)this->n,0,(char *)(ulong)(this->n - 1),0,2);
  iVar21 = (this->codon_index).
           super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start[extraout_EAX_16].
           super__Tuple_impl<0UL,_int,_int,_double>.super__Tuple_impl<1UL,_int,_double>.
           super__Head_base<1UL,_int,_false>._M_head_impl;
  iVar32 = this->n;
  pdVar12 = (this->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  std::_Tuple_impl<1ul,std::__cxx11::string,std::__cxx11::string>::
  _Tuple_impl<std::__cxx11::string&,std::__cxx11::string&,void>
            ((_Tuple_impl<1ul,std::__cxx11::string,std::__cxx11::string> *)__return_storage_ptr__,
             &rna,&bp);
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).super__Head_base<0UL,_double,_false>._M_head_impl =
       pdVar12[(int)(iVar21 + iVar20 * 6 + (iVar32 * 9 + 9) * uVar37 * 0x24 + 0x120)];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rna._M_dataplus._M_p != &rna.field_2) {
    operator_delete(rna._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)bp._M_dataplus._M_p != &bp.field_2) {
    operator_delete(bp._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

tuple<double, string, string> Nussinov::nussinov(ostream &fout) {
    auto start = chrono::high_resolution_clock::now();
    fout << "Nussinov" << endl;

    double ans = 0;
    double ret = 0;
    double local_max = 0;

    // when a == b
    for (int a = 0,b; a < n; a++) {
        b=a;
        const int n_codon_a = n_codon[protein[a]];
        for (int l = 0; l < 3; l++) {
            for (int i = 0 , j; i+l < 3; i++) {
                j = i + l;
                if (sigma(b, j) - sigma(a, i) <= g) continue;
                for (int x = 0; x < n_codon_a; x++) {
                    ret = 0;
                    if (complementary(nucleotides[protein[a]][x][i], nucleotides[protein[b]][x][j])) {
                        // F [a][b][i + 1][j − 1][x][x] + 1
                        if (i <= 1 && j >= 1 && i < j - 1) {
                            ret = max(ret, Access(a, b,i + 1, j - 1, x, x) + 1);
                        }

                    }

                    //F [a][b][i + 1][j][x][x]
                    if (i <= 1 && i + 1 <= j) {
                        ret = max(ret, Access(a, b, i + 1, j, x, x));
                    }
                    //F [a][b][i][j − 1][x][x]
                    if (j >= 1 && i <= j - 1) {
                        ret = max(ret, Access(a, b, i, j - 1, x, x));
                    }

                    if (ret > get<2>(codon_index[m(n, a, b,i,j)])) {
                        codon_index[m(n,a,b,i,j)] = make_tuple(x,x,ret);
                    }
                    if (ret > get<2>(codon_index_x[m(n, a, b,i,j,x)])) {
                        codon_index_x[m(n,a,b,i,j,x)] = make_tuple(x,x,ret);
                    }
                    if (ret > get<2>(codon_index_y[m(n, a, b,i,j,x)])) {
                        codon_index_y[m(n,a,b,i,j,x)] = make_tuple(x,x,ret);
                    }
                    Access(a, b, i, j, x, x) = ret;
                }
//                cout << "a: " << a << ",b: " << b << ",i: " << i << ",j: " << j << ",index: " << (9*n*(b-a)+(3*j-2*i)) << endl;
            }
        }
    }


    for (int len = 1; len < n; len++) {
        for(int a = 0,b; a+len < n; a++){
            b=a+len;
            const int n_codon_a = n_codon[protein[a]];
            const int n_codon_b = n_codon[protein[b]];
            for (int i = 2; i >= 0; i--) {
                for (int j = 0; j < 3; j++) {
                    if (sigma(b,j) - sigma(a,i) <= g) continue;
                    for (int x = 0; x < n_codon_a; x++) {
                        for (int y = 0; y < n_codon_b; y++) {
                            ret = 0;
                            // i, j pair
                            if (complementary(nucleotides[protein[a]][x][i], nucleotides[protein[b]][y][j])) {
                                //F [a][b][i + 1][j − 1][x][y] + 1
                                if (i <= 1 && j >= 1) {
                                    ret = max(ret, Access(a, b, i + 1,j - 1,x,y) + 1);
                                }

                                if (i == 2 && j >=1) {
                                    // 1 + maxx′ ∈S(va+1){1 + F [a + 1][b][1][j − 1][x′][y]}
                                    if (a + 1 < b) {
                                        const int n_codon_an = n_codon[protein[a+1]];
                                        local_max = 0;
                                        for (int p = 0; p < n_codon_an; p++) {
                                            local_max = max(local_max, Access(a+1, b, 0, j - 1,p,y));
                                        }
                                        ret = max(ret, local_max + 1);
                                    }
                                    // 1 + F [a + 1][b][1][j − 1][y][y]
                                    if (a + 1 == b) {
                                        ret = max(ret, Access(a+1, b, 0, j-1, y, y) + 1);
                                    }
                                }

                                if (i <= 1 && j == 0) {
                                    // 1 + maxy′∈S(vb−1){F [a][b − 1][i + 1][3][x][y′]}
                                    if (a < b - 1) {
                                        const int n_codon_bp = n_codon[protein[b-1]];
                                        local_max = 0;
                                        for (int q = 0; q < n_codon_bp; q++) {
                                            local_max = max(local_max, Access(a, b-1, i + 1, 2, x, q));
                                        }
                                        ret = max(ret, local_max + 1);
                                    }
                                    // 1 + F [a][b − 1][i + 1][3][x][x]
                                    if (a == b - 1) {
                                        ret = max(ret, Access(a, b-1, i+1, 2, x, x) + 1);
                                    }
                                }

                                if (i == 2 && j == 0) {
                                    // 1 + maxx′ ∈S(va+1),y′ ∈S(vb−1){F [a + 1][b − 1][1][3][x′][y′]}
                                    if (a + 1 < b - 1) {
                                        const int n_codon_an = n_codon[protein[a+1]];
                                        const int n_codon_bp = n_codon[protein[b-1]];
                                        local_max = 0;
                                        for (int p = 0; p < n_codon_an; p++) {
                                            for (int q = 0; q < n_codon_bp; q++) {
                                                local_max = max(local_max, Access(a+1, b-1, 0,2,p,q));
                                            }
                                        }
                                        ret = max(ret, local_max + 1);
                                    }
                                    // 1 + maxx′ ∈S(va+1){F [a + 1][b − 1][1][3][x′][x′]}
                                    if (a + 1 == b - 1) {
                                        const int n_codon_an = n_codon[protein[a+1]];
                                        local_max = 0;
                                        for (int p = 0; p < n_codon_an; p++) {
                                            local_max = max(local_max, Access(a+1, b-1, 0,2,p,p));
                                        }
                                        ret = max(ret, local_max + 1);
                                    }
                                    // 1
                                    if (sigma(b,j) - 1 == sigma(a,i) + g) { //
                                        ret = max(ret, (double)1.0);
                                    }
                                }

                            }
                            // F [a][b][i + 1][j][x][y]
                            if (i <= 1) {
                                ret = max(ret, Access(a, b, i + 1,j,x,y));
                            }
                            // F [a][b][i][j − 1][x][y]
                            if (j >= 1) {
                                ret = max(ret, Access(a, b, i,j - 1,x,y));
                            }

                            if (i == 2) {
                                // maxx′ ∈S(va+1) F [a + 1][b][1][j][x′][y]
                                if (a + 1 < b) {
                                    const int n_codon_an = n_codon[protein[a+1]];
                                    for (int p = 0; p < n_codon_an; p++) {
                                        ret = max(ret, Access(a+1, b, 0, j,p,y));
                                    }
                                }
                                // F [a + 1][b][1][j][y][y]
                                if (a + 1 == b) {
                                    ret = max(ret, Access(a+1, b, 0, j, y, y));
                                }
                            }

                            if (j == 0) {
                                // maxy′ ∈S(vb−1 ) F [a][b − 1][i][3][x][y′]
                                if (a < b - 1) {
                                    const int n_codon_bp = n_codon[protein[b-1]];
                                    for (int q = 0; q < n_codon_bp; q++) {
                                        ret = max(ret, Access(a, b - 1, i, 2, x, q));
                                    }
                                }
                                // F [a][b − 1][i][3][x][x]
                                if (a == b - 1) {
                                    ret = max(ret, Access(a, b - 1, i, 2, x, x));
                                }
                            }

                            // bifurication

                            // maxa<c<b−1,y′ ∈S(vc ),x′∈S(vc+1){F [a][c][i][3][x][y′] + F [c + 1][b][1][j][x′][y]}
                            if (a < b - 2) {
                                for (int c = a + 1; c < b-1; c++) {
                                    const int n_codon_cn = n_codon[protein[c+1]];
                                    const int n_codon_c = n_codon[protein[c]];
                                    for (int p = 0; p < n_codon_cn; p++) {
                                        for (int q = 0; q < n_codon_c; q++) {
                                            ret = max(ret, Access(a,c, i,2,x,q) + Access(c + 1, b, 0,j,p,y));
                                        }
                                    }
                                }
                            }
                            // maxx′ ∈S(va+1){F [a][a][i][3][x][x] + F [a + 1][b][1][j][x′][y]}
                            if (a < b-1 && i <= 2) {
                                const int n_codon_an = n_codon[protein[a+1]];
                                for (int p = 0; p < n_codon_an; p++) {
                                    ret = max(ret, Access(a, a, i, 2, x, x) + Access(a + 1, b, 0, j, p, y));
                                }
                            }
                            // maxy′∈S(vb−1 ){F [a][b − 1][i][3][x][y′] + F [b][b][1][j][y][y]}
                            if (a < b - 1 && j >= 0) {
                                const int n_codon_bp = n_codon[protein[b-1]];
                                for (int q = 0; q < n_codon_bp; q++) {
                                    ret = max(ret, Access(a, b - 1, i, 2, x, q) + Access(b, b, 0, j, y, y));
                                }
                            }
                            // F [a][a][i][3][x][x] + F [b][b][1][j][y][y]
                            if (a == b - 1 && i <= 2 && j >= 0) {
                                ret = max(ret, Access(a, a, i, 2, x, x) + Access(b, b, 0, j, y, y));
                            }
                            // maxk<3,a<c<b,x′ ∈S(vc ){F [a][c][i][k][x][x′] + F [c][b][k + 1][j][x′][y]}
                            if (a < b - 1) {
                                for (int c = a+1; c < b; c++) {
                                    for (int k = 0; k < 2; k++) {
                                        const int n_codon_c = n_codon[protein[c]];
                                        for (int q = 0; q < n_codon_c; q++) {
                                            ret = max(ret, Access(a, c, i,k,x,q) + Access(c, b, k + 1,j,q,y));
                                        }
                                    }
                                }
                            }
                            // F [a][a][1][2][x][x] + F [a][b][3][j][x][y]
                            if (a < b && i <= 1) {
                                for (int k = i; k < 2; k++) {
                                    ret = max(ret, Access(a, a, i, k, x, x) + Access(a, b, k+1, j, x, y));
                                }
                            }
                            // F [a][b][i][1][x][y] + F [b][b][2][3][y][y]
                            if (a < b && j >= 1) {
                                for (int k = 0; k <= j - 1; k++) {
                                    ret = max(ret, Access(a, b, i, k, x, y) + Access(b, b, k+1, j, y, y));
                                }
                            }

                            if (ret > get<2>(codon_index[m(n, a, b,i,j)])) {
                                codon_index[m(n,a,b,i,j)] = make_tuple(x,y,ret);
                            }
                            if (ret > get<2>(codon_index_x[m(n, a, b,i,j,x)])) {
                                codon_index_x[m(n,a,b,i,j,x)] = make_tuple(x,y,ret);
                            }
                            if (ret > get<2>(codon_index_y[m(n, a, b,i,j,y)])) {
                                codon_index_y[m(n,a,b,i,j,y)] = make_tuple(x,y,ret);
                            }
                            Access(a, b, i, j, x, y) = ret;

                            ans = max(ans, ret);
                        }
                    }

//                    fout << "a: " << a << ",b: " << b << ",i: " << i << ",j: " << j << ",ret: " << ret << endl;
                }
            }

        }
    }


    // find rna and base pair
    string bp = find_bp(0, n-1, 0, 2, get<0>(codon_index[m(n,0,n-1,0,2)]), get<1>(codon_index[m(n,0,n-1,0,2)]), 0);
    string rna = find_bp(0, n-1, 0, 2, get<0>(codon_index[m(n,0,n-1,0,2)]), get<1>(codon_index[m(n,0,n-1,0,2)]), 1);


    fout << "corresponding base pairs: " << bp << ",length: " << bp.size() << endl;
//    fout << "corresponding base pairs (Nussinov Validation): " << nuss_bp << ",length: " << nuss_bp.size() << endl;
    fout << "corresponding rna: " << rna << ",size: " << rna.size() << endl;
//    fout << "corresponding rna2: " << rna2 << ",size: " << rna.size() << endl;
    fout << "max base pair: " << ans << endl;
//    fout << "max base pair: (Nussinov Validation): " << nuss_ans << endl;
    auto end = chrono::high_resolution_clock::now();
    long time_take = chrono::duration_cast<chrono::seconds>(end - start).count();
    fout << "Time taken by program is : " << time_take;
    fout << "sec" << endl;

    return make_tuple(Access(0, n-1, 0, 2, get<0>(codon_index[m(n,0,n-1,0,2)]), get<1>(codon_index[m(n,0,n-1,0,2)])), rna, bp); //,0,2
}